

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall test_result_wrapper::fail_if(test_result_wrapper *this,bool condition,char *text)

{
  ostream *poVar1;
  char *text_local;
  bool condition_local;
  test_result_wrapper *this_local;
  
  if (condition) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    poVar1 = std::operator<<(poVar1,text);
    std::operator<<(poVar1,"\n");
    this->pass = false;
  }
  return;
}

Assistant:

void fail_if(bool condition, const char *text){
        if (condition){
            cerr << "ERROR: " << text << "\n";
            pass = false;
        }
    }